

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_has_side(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_BOOL *has_side)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  *has_side = 0;
  if (((-1 < node0) && (pRVar1 = ref_cell->ref_adj, node0 < pRVar1->nnode)) &&
     (lVar5 = (long)pRVar1->first[(uint)node0], lVar5 != -1)) {
    pRVar4 = pRVar1->item + lVar5;
    while( true ) {
      if (0 < ref_cell->edge_per) {
        pRVar2 = ref_cell->e2n;
        pRVar3 = ref_cell->c2n;
        lVar7 = (long)ref_cell->size_per * (long)pRVar4->ref;
        lVar6 = (long)(int)lVar7;
        uVar8 = 0;
        do {
          if (((pRVar3[pRVar2[uVar8 * 2] + lVar7] == node0) &&
              (pRVar3[pRVar2[uVar8 * 2 + 1] + lVar6] == node1)) ||
             ((pRVar3[pRVar2[uVar8 * 2] + lVar7] == node1 &&
              (pRVar3[pRVar2[uVar8 * 2 + 1] + lVar6] == node0)))) {
            *has_side = 1;
            return 0;
          }
          uVar8 = uVar8 + 1;
        } while ((uint)ref_cell->edge_per != uVar8);
      }
      pRVar4 = ref_cell->ref_adj->item;
      lVar5 = (long)pRVar4[(int)lVar5].next;
      if (lVar5 == -1) break;
      pRVar4 = pRVar4 + lVar5;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_has_side(REF_CELL ref_cell, REF_INT node0,
                                     REF_INT node1, REF_BOOL *has_side) {
  REF_INT item, cell;
  REF_INT cell_edge;

  *has_side = REF_FALSE;

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), node0, item, cell)
      each_ref_cell_cell_edge(
          ref_cell,
          cell_edge) if ((node0 == ref_cell_e2n(ref_cell, 0, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 1, cell_edge, cell)) ||
                         (node0 == ref_cell_e2n(ref_cell, 1, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 0, cell_edge, cell))) {
    *has_side = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}